

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O1

void __thiscall QMenu::keyPressEvent(QMenu *this,QKeyEvent *e)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined4 uVar13;
  undefined4 uVar14;
  QMenuPrivate *this_00;
  QAction *pQVar15;
  QAction *pQVar16;
  QWidget *pQVar17;
  QWidgetData *pQVar18;
  Data *pDVar19;
  ushort *puVar20;
  QRect *pQVar21;
  byte bVar22;
  char cVar23;
  short sVar24;
  short sVar25;
  LayoutDirection LVar26;
  int iVar27;
  int iVar28;
  QAction *pQVar29;
  long lVar30;
  QStyle *pQVar31;
  qsizetype qVar32;
  QObject *pQVar33;
  QAction *pQVar34;
  uint uVar35;
  ScrollDirection direction;
  ScrollLocation SVar36;
  QArrayData *pQVar37;
  long lVar38;
  ulong uVar39;
  ulong uVar40;
  long lVar41;
  long in_FS_OFFSET;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  QRect QVar56;
  QKeySequence sequence;
  ScrollLocation local_c8;
  QAction *local_c0;
  QAction *local_a0;
  QArrayData *local_78;
  QRect local_60;
  QStringView local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMenuPrivate **)&(this->super_QWidget).field_0x8;
  local_60 = QMenuPrivate::popupGeometry(this_00,(QScreen *)0x0);
  QMenuPrivate::updateActionRects(this_00,&local_60);
  iVar28 = *(int *)(e + 0x40);
  LVar26 = QWidget::layoutDirection(&this->super_QWidget);
  iVar52 = iVar28;
  if (((LVar26 == RightToLeft) && (iVar52 = 0x1000014, iVar28 != 0x1000012)) &&
     (iVar52 = 0x1000012, iVar28 != 0x1000014)) {
    iVar52 = iVar28;
  }
  iVar28 = 0x1000015;
  if (iVar52 != 0x1000001) {
    iVar28 = iVar52;
  }
  iVar52 = 0x1000013;
  if (iVar28 != 0x1000002) {
    iVar52 = iVar28;
  }
  bVar42 = false;
  if (iVar52 < 0x1000010) {
    if (iVar52 + 0xfefffffcU < 2) {
LAB_004660b4:
      if (this_00->currentAction == (QAction *)0x0) {
        QMenuPrivate::setFirstActionActive(this_00);
      }
      else {
        QMenuPrivate::setSyncAction(this_00);
        QAction::menuObject();
        lVar30 = QMetaObject::cast((QObject *)&staticMetaObject);
        pQVar29 = this_00->currentAction;
        if (lVar30 != 0) goto LAB_004660f5;
        QMenuPrivate::activateAction(this_00,pQVar29,Trigger,true);
      }
LAB_0046636e:
      bVar42 = true;
    }
    else if (iVar52 == 0x20) {
      pQVar31 = QWidget::style(&this->super_QWidget);
      bVar42 = false;
      iVar28 = (**(code **)(*(long *)pQVar31 + 0xf0))(pQVar31,0xf,0,this,0);
      if (iVar28 != 0) goto LAB_004660b4;
    }
    goto switchD_00465bf7_caseD_1000018;
  }
  bVar42 = false;
  switch(iVar52) {
  case 0x1000010:
    bVar42 = true;
    if (this_00->scroll != (QMenuScroller *)0x0) {
LAB_00466237:
      SVar36 = ScrollTop;
LAB_0046623f:
      bVar42 = true;
      QMenuPrivate::scrollMenu(this_00,SVar36,true);
    }
    break;
  case 0x1000011:
    bVar42 = true;
    if (this_00->scroll != (QMenuScroller *)0x0) {
LAB_00466202:
      SVar36 = ScrollBottom;
      goto LAB_0046623f;
    }
    break;
  case 0x1000012:
    goto switchD_00465bf7_caseD_1000012;
  case 0x1000013:
  case 0x1000015:
    if (this_00->currentAction == (QAction *)0x0) {
      lVar30 = (this_00->super_QWidgetPrivate).actions.d.size;
      if (iVar52 == 0x1000015) {
        if (lVar30 != 0) {
          lVar30 = 8;
          uVar39 = 0;
          do {
            pQVar21 = (this_00->actionRects).d.ptr;
            uVar7 = *(undefined8 *)((long)pQVar21 + lVar30 + -8);
            uVar8 = *(undefined8 *)((long)&(pQVar21->x1).m_i + lVar30);
            iVar28 = -(uint)((int)uVar8 == (int)uVar7 + -1);
            iVar52 = -(uint)((int)((ulong)uVar8 >> 0x20) == (int)((ulong)uVar7 >> 0x20) + -1);
            auVar47._4_4_ = iVar28;
            auVar47._0_4_ = iVar28;
            auVar47._8_4_ = iVar52;
            auVar47._12_4_ = iVar52;
            iVar28 = movmskpd((int)pQVar21,auVar47);
            if (iVar28 != 3) {
              pQVar29 = (this_00->super_QWidgetPrivate).actions.d.ptr[uVar39];
              bVar42 = QMenuPrivate::considerAction(this_00,pQVar29);
              if (bVar42) break;
            }
            uVar39 = uVar39 + 1;
            lVar30 = lVar30 + 0x10;
            pQVar29 = (QAction *)0x0;
          } while (uVar39 < (ulong)(this_00->super_QWidgetPrivate).actions.d.size);
LAB_0046645c:
          local_c8 = ScrollStay;
          goto LAB_00466471;
        }
      }
      else {
        uVar35 = (int)lVar30 - 1;
        if (-1 < (int)uVar35) {
          lVar41 = (ulong)uVar35 << 4;
          lVar30 = (ulong)uVar35 + 1;
          do {
            pQVar21 = (this_00->actionRects).d.ptr;
            uVar7 = *(undefined8 *)((long)&(pQVar21->x1).m_i + lVar41);
            uVar8 = *(undefined8 *)((long)&(pQVar21->x2).m_i + lVar41);
            iVar28 = -(uint)((int)uVar8 == (int)uVar7 + -1);
            iVar52 = -(uint)((int)((ulong)uVar8 >> 0x20) == (int)((ulong)uVar7 >> 0x20) + -1);
            auVar48._4_4_ = iVar28;
            auVar48._0_4_ = iVar28;
            auVar48._8_4_ = iVar52;
            auVar48._12_4_ = iVar52;
            iVar28 = movmskpd((int)pQVar21,auVar48);
            if (iVar28 != 3) {
              pQVar29 = (this_00->super_QWidgetPrivate).actions.d.ptr[lVar30 + -1];
              bVar42 = QMenuPrivate::considerAction(this_00,pQVar29);
              if (bVar42) break;
            }
            lVar41 = lVar41 + -0x10;
            lVar38 = lVar30 + -1;
            bVar42 = 0 < lVar30;
            lVar30 = lVar38;
            pQVar29 = (QAction *)0x0;
          } while (lVar38 != 0 && bVar42);
          goto LAB_0046645c;
        }
      }
LAB_00466466:
      local_c8 = ScrollStay;
      pQVar29 = (QAction *)0x0;
    }
    else {
      if ((this_00->super_QWidgetPrivate).actions.d.size == 0) goto LAB_00466466;
      iVar28 = 0;
      local_c8 = ScrollStay;
      uVar39 = 0;
      do {
        pQVar34 = this_00->currentAction;
        pQVar15 = (this_00->super_QWidgetPrivate).actions.d.ptr[uVar39];
        if (pQVar15 == pQVar34) {
          if (iVar52 == 0x1000013) {
            uVar40 = uVar39 & 0xffffffff;
            pQVar29 = (QAction *)0x0;
            do {
              iVar55 = (int)uVar40;
              if (iVar55 == 0) {
                pQVar31 = QWidget::style(&this->super_QWidget);
                iVar55 = (**(code **)(*(long *)pQVar31 + 0xf0))(pQVar31,0x49,0);
                if (iVar55 == 0) break;
                if (this_00->scroll != (QMenuScroller *)0x0) {
                  local_c8 = ScrollBottom;
                }
                iVar55 = (int)(this_00->actionRects).d.size;
              }
              uVar35 = iVar55 - 1;
              uVar40 = (ulong)uVar35;
              pQVar16 = (this_00->super_QWidgetPrivate).actions.d.ptr[(int)uVar35];
              if (pQVar16 == this_00->currentAction) {
                bVar42 = false;
              }
              else {
                pQVar21 = (this_00->actionRects).d.ptr;
                uVar1 = pQVar21[(int)uVar35].x1;
                uVar9 = pQVar21[(int)uVar35].y1;
                uVar2 = pQVar21[(int)uVar35].x2;
                uVar10 = pQVar21[(int)uVar35].y2;
                iVar55 = -(uint)(uVar2 == uVar1 + -1);
                iVar53 = -(uint)(uVar10 == uVar9 + -1);
                auVar45._4_4_ = iVar55;
                auVar45._0_4_ = iVar55;
                auVar45._8_4_ = iVar53;
                auVar45._12_4_ = iVar53;
                iVar55 = movmskpd((int)pQVar21,auVar45);
                bVar42 = true;
                if ((iVar55 != 3) &&
                   (bVar43 = QMenuPrivate::considerAction(this_00,pQVar16), bVar43)) {
                  if ((this_00->scroll != (QMenuScroller *)0x0) &&
                     ((this_00->scroll->scrollFlags & 1) != 0)) {
                    pQVar17 = *(QWidget **)&(this_00->super_QWidgetPrivate).field_0x8;
                    pQVar31 = QWidget::style(pQVar17);
                    iVar55 = (**(code **)(*(long *)pQVar31 + 0xe0))(pQVar31,0x1b,0,pQVar17);
                    if ((this_00->field_0x421 & 2) != 0) {
                      pQVar31 = QWidget::style(&this->super_QWidget);
                      iVar53 = (**(code **)(*(long *)pQVar31 + 0xe0))(pQVar31,0x1f,0,this);
                      iVar55 = iVar55 + iVar53;
                    }
                    pQVar21 = (this_00->actionRects).d.ptr;
                    if ((iVar28 - iVar55) + this_00->scroll->scrollOffset <=
                        (pQVar21[(int)uVar35].y2.m_i - pQVar21[(int)uVar35].y1.m_i) + 1) {
                      local_c8 = ScrollTop;
                    }
                  }
                  bVar42 = false;
                  pQVar29 = pQVar16;
                }
              }
            } while (bVar42);
            if (pQVar29 == (QAction *)0x0) {
              if ((*(uint *)&this_00->field_0x420 >> 9 & 1) != 0) {
                *(ushort *)&this_00->field_0x420 = (ushort)*(uint *)&this_00->field_0x420 | 0x800;
              }
              goto LAB_00465c76;
            }
          }
          else {
            pQVar21 = (this_00->actionRects).d.ptr;
            iVar55 = (iVar28 + pQVar21[uVar39].y2.m_i) - pQVar21[uVar39].y1.m_i;
            iVar28 = iVar55 + 1;
            uVar40 = uVar39 & 0xffffffff;
            pQVar29 = (QAction *)0x0;
            do {
              uVar35 = (int)uVar40 + 1;
              uVar40 = (ulong)uVar35;
              if ((this_00->actionRects).d.size == (long)(int)uVar35) {
                pQVar31 = QWidget::style(&this->super_QWidget);
                iVar53 = (**(code **)(*(long *)pQVar31 + 0xf0))(pQVar31,0x49,0);
                if (iVar53 == 0) break;
                if (this_00->scroll != (QMenuScroller *)0x0) {
                  local_c8 = ScrollTop;
                }
                uVar40 = 0;
              }
              iVar53 = (int)uVar40;
              pQVar16 = (this_00->super_QWidgetPrivate).actions.d.ptr[iVar53];
              if (pQVar16 == this_00->currentAction) {
                bVar42 = false;
              }
              else {
                pQVar21 = (this_00->actionRects).d.ptr;
                uVar3 = pQVar21[iVar53].x1;
                uVar11 = pQVar21[iVar53].y1;
                uVar4 = pQVar21[iVar53].x2;
                uVar12 = pQVar21[iVar53].y2;
                iVar51 = -(uint)(uVar4 == uVar3 + -1);
                iVar54 = -(uint)(uVar12 == uVar11 + -1);
                auVar46._4_4_ = iVar51;
                auVar46._0_4_ = iVar51;
                auVar46._8_4_ = iVar54;
                auVar46._12_4_ = iVar54;
                iVar51 = movmskpd((int)pQVar21,auVar46);
                bVar42 = true;
                if ((iVar51 != 3) &&
                   (bVar43 = QMenuPrivate::considerAction(this_00,pQVar16), bVar43)) {
                  SVar36 = local_c8;
                  if ((this_00->scroll != (QMenuScroller *)0x0) &&
                     ((this_00->scroll->scrollFlags & 2) != 0)) {
                    pQVar18 = (this->super_QWidget).data;
                    iVar51 = (pQVar18->crect).y1.m_i;
                    iVar54 = (pQVar18->crect).y2.m_i;
                    pQVar17 = *(QWidget **)&(this_00->super_QWidgetPrivate).field_0x8;
                    pQVar31 = QWidget::style(pQVar17);
                    iVar27 = (**(code **)(*(long *)pQVar31 + 0xe0))(pQVar31,0x1b,0,pQVar17);
                    iVar51 = (iVar54 - (iVar27 + iVar51)) + 1;
                    if ((this_00->scroll->scrollFlags & 1) != 0) {
                      pQVar17 = *(QWidget **)&(this_00->super_QWidgetPrivate).field_0x8;
                      pQVar31 = QWidget::style(pQVar17);
                      iVar54 = (**(code **)(*(long *)pQVar31 + 0xe0))(pQVar31,0x1b,0,pQVar17);
                      iVar51 = iVar51 - iVar54;
                    }
                    if ((this_00->field_0x421 & 2) != 0) {
                      pQVar31 = QWidget::style(&this->super_QWidget);
                      iVar54 = (**(code **)(*(long *)pQVar31 + 0xe0))(pQVar31,0x1f,0,this);
                      iVar51 = iVar51 - iVar54;
                    }
                    pQVar21 = (this_00->actionRects).d.ptr;
                    SVar36 = ScrollBottom;
                    if ((this_00->scroll->scrollOffset + iVar55 + 2 + pQVar21[iVar53].y2.m_i) -
                        pQVar21[iVar53].y1.m_i <= iVar51) {
                      SVar36 = local_c8;
                    }
                  }
                  local_c8 = SVar36;
                  bVar42 = false;
                  pQVar29 = pQVar16;
                }
              }
            } while (bVar42);
          }
        }
        else {
          pQVar21 = (this_00->actionRects).d.ptr;
          iVar28 = ((iVar28 + pQVar21[uVar39].y2.m_i) - pQVar21[uVar39].y1.m_i) + 1;
LAB_00465c76:
          pQVar29 = (QAction *)0x0;
        }
      } while (((pQVar15 != pQVar34) && (pQVar29 == (QAction *)0x0)) &&
              (uVar39 = uVar39 + 1, uVar39 < (ulong)(this_00->super_QWidgetPrivate).actions.d.size))
      ;
    }
LAB_00466471:
    bVar42 = true;
    if (pQVar29 != (QAction *)0x0) {
      if ((this_00->scroll != (QMenuScroller *)0x0) && (local_c8 != ScrollStay)) {
        QBasicTimer::stop();
        QMenuPrivate::scrollMenu(this_00,pQVar29,local_c8,false);
      }
      QMenuPrivate::setCurrentAction(this_00,pQVar29,-1,SelectedFromKeyboard,false);
    }
    break;
  case 0x1000014:
    if ((this_00->currentAction != (QAction *)0x0) &&
       (cVar23 = QAction::isEnabled(), cVar23 != '\0')) {
      QAction::menuObject();
      lVar30 = QMetaObject::cast((QObject *)&staticMetaObject);
      if (lVar30 != 0) {
        pQVar29 = this_00->currentAction;
LAB_004660f5:
        QMenuPrivate::popupAction(this_00,pQVar29,0,true);
        goto LAB_0046636e;
      }
    }
switchD_00465bf7_caseD_1000012:
    if ((this_00->currentAction == (QAction *)0x0) || (this_00->scroll != (QMenuScroller *)0x0)) {
      bVar42 = false;
    }
    else {
      QVar56 = QMenuPrivate::actionRect(this_00,this_00->currentAction);
      lVar41 = QVar56._8_8_ >> 0x20;
      lVar30 = QVar56._0_8_ >> 0x20;
      if (iVar52 == 0x1000012) {
        if (QVar56.x1.m_i.m_i < 1) {
LAB_0046659b:
          pQVar29 = (QAction *)0x0;
        }
        else {
          lVar41 = lVar41 + lVar30;
          uVar39 = (ulong)(QVar56.x1.m_i.m_i & 0x7fffffff);
          do {
            pQVar29 = QMenuPrivate::actionAt
                                (this_00,(QPoint)((lVar41 - (lVar41 >> 0x3f) & 0xfffffffffffffffeU)
                                                  * 0x80000000 + -1 + uVar39));
            if (pQVar29 != (QAction *)0x0) break;
            bVar42 = 1 < (long)uVar39;
            uVar39 = uVar39 - 1;
          } while (bVar42);
        }
      }
      else {
        uVar35 = QVar56.x2.m_i.m_i + 1;
        pQVar18 = (this->super_QWidget).data;
        if (((pQVar18->crect).x2.m_i - (pQVar18->crect).x1.m_i) + 1 <= (int)uVar35)
        goto LAB_0046659b;
        lVar41 = lVar41 + lVar30;
        do {
          pQVar29 = QMenuPrivate::actionAt
                              (this_00,(QPoint)((ulong)uVar35 |
                                               (lVar41 - (lVar41 >> 0x3f) & 0xfffffffffffffffeU) <<
                                               0x1f));
          if (pQVar29 != (QAction *)0x0) break;
          uVar35 = uVar35 + 1;
          pQVar18 = (this->super_QWidget).data;
        } while ((int)uVar35 < ((pQVar18->crect).x2.m_i - (pQVar18->crect).x1.m_i) + 1);
      }
      bVar42 = pQVar29 != (QAction *)0x0;
      if (bVar42) {
        QMenuPrivate::setCurrentAction(this_00,pQVar29,-1,SelectedFromKeyboard,false);
      }
    }
    if ((iVar52 == 0x1000012 && !bVar42) &&
       (lVar30 = QMetaObject::cast((QObject *)&staticMetaObject), lVar30 != 0)) {
      pDVar19 = (this_00->causedPopup).widget.wp.d;
      if (pDVar19 == (Data *)0x0) {
        QMenuPrivate::hideMenu(this_00,this);
      }
      else {
        pQVar17 = (QWidget *)(this_00->causedPopup).widget.wp.value;
        LOCK();
        *(int *)pDVar19 = *(int *)pDVar19 + 1;
        UNLOCK();
        QMenuPrivate::hideMenu(this_00,this);
        if (*(int *)(pDVar19 + 4) != 0 && pQVar17 != (QWidget *)0x0) {
          QWidget::setFocus(pQVar17,OtherFocusReason);
        }
      }
      bVar42 = true;
      if (pDVar19 != (Data *)0x0) {
        LOCK();
        *(int *)pDVar19 = *(int *)pDVar19 + -1;
        UNLOCK();
        if (*(int *)pDVar19 == 0) {
          operator_delete(pDVar19);
        }
      }
    }
    break;
  case 0x1000016:
    bVar42 = true;
    if ((this_00->currentAction != (QAction *)0x0) && (this_00->scroll != (QMenuScroller *)0x0)) {
      if ((this_00->scroll->scrollFlags & 1) == 0) goto LAB_00466237;
      direction = ScrollUp;
LAB_00466587:
      bVar42 = true;
      QMenuPrivate::scrollMenu(this_00,direction,true,true);
    }
    break;
  case 0x1000017:
    bVar42 = true;
    if ((this_00->currentAction != (QAction *)0x0) && (this_00->scroll != (QMenuScroller *)0x0)) {
      if ((this_00->scroll->scrollFlags & 2) != 0) {
        direction = ScrollDown;
        goto LAB_00466587;
      }
      goto LAB_00466202;
    }
    break;
  case 0x1000018:
  case 0x1000019:
  case 0x100001a:
  case 0x100001b:
  case 0x100001c:
  case 0x100001d:
  case 0x100001e:
  case 0x100001f:
  case 0x1000020:
  case 0x1000021:
  case 0x1000022:
    break;
  case 0x1000023:
    if ((this_00->field_0x421 & 4) == 0) {
      pQVar31 = QWidget::style(&this->super_QWidget);
      iVar28 = (**(code **)(*(long *)pQVar31 + 0xf0))(pQVar31,0x12,0,this,0);
      bVar42 = true;
      if (iVar28 != 0) {
        QMenuPrivate::hideMenu(this_00,this);
        QApplication::focusWidget();
        lVar30 = QMetaObject::cast((QObject *)&QMenuBar::staticMetaObject);
        if (lVar30 != 0) {
          QMenuBarPrivate::setKeyboardMode(*(QMenuBarPrivate **)(lVar30 + 8),false);
        }
      }
    }
    else {
      bVar42 = false;
    }
    break;
  default:
    if (iVar52 == 0x1000030) {
      if (this_00->currentAction == (QAction *)0x0) {
        bVar42 = true;
      }
      else {
        QAction::whatsThis();
        bVar42 = local_60._8_8_ == 0;
        if ((QArrayData *)local_60._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_60._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_60._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_60._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_60._0_8_,2,0x10);
          }
        }
      }
      if (!bVar42) {
        QWhatsThis::enterWhatsThisMode();
        QMenuPrivate::activateAction(this_00,this_00->currentAction,Trigger,true);
        goto LAB_00466caf;
      }
      bVar42 = false;
    }
  }
switchD_00465bf7_caseD_1000018:
  if (!bVar42) {
    iVar28 = 0x46;
    cVar23 = QKeyEvent::matches((StandardKey)e);
    if (cVar23 != '\0') {
      if ((this_00->field_0x421 & 4) != 0) {
        QWidget::close(&this->super_QWidget,iVar28);
        goto LAB_00466caf;
      }
      pDVar19 = (this_00->causedPopup).widget.wp.d;
      if (pDVar19 == (Data *)0x0) {
        QMenuPrivate::hideMenu(this_00,this);
      }
      else {
        LOCK();
        *(int *)pDVar19 = *(int *)pDVar19 + 1;
        UNLOCK();
        QMenuPrivate::hideMenu(this_00,this);
      }
      lVar30 = QMetaObject::cast((QObject *)&QMenuBar::staticMetaObject);
      if (lVar30 != 0) {
        QMenuBarPrivate::setCurrentAction
                  (*(QMenuBarPrivate **)(lVar30 + 8),this_00->menuAction,false,false);
        QMenuBarPrivate::setKeyboardMode(*(QMenuBarPrivate **)(lVar30 + 8),true);
      }
      bVar42 = true;
      if (pDVar19 != (Data *)0x0) {
        LOCK();
        *(int *)pDVar19 = *(int *)pDVar19 + -1;
        UNLOCK();
        if (*(int *)pDVar19 == 0) {
          operator_delete(pDVar19);
        }
      }
    }
  }
  if (!bVar42) {
    pQVar37 = (QArrayData *)e;
    iVar28 = QKeyEvent::modifiers();
    bVar22 = 1;
    bVar43 = false;
    if (iVar28 < 0x8000000) {
      if ((iVar28 == 0) || (bVar43 = false, iVar28 == 0x2000000)) goto LAB_00466769;
    }
    else if ((iVar28 == 0x8000000) || ((iVar28 == 0x28000000 || (iVar28 == 0x20000000)))) {
LAB_00466769:
      pQVar37 = *(QArrayData **)(e + 0x28);
      lVar30 = *(long *)(e + 0x38);
      if (pQVar37 != (QArrayData *)0x0) {
        LOCK();
        (pQVar37->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar37->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      bVar22 = 0;
      bVar43 = lVar30 == 1;
    }
    if (!(bool)(pQVar37 == (QArrayData *)0x0 | bVar22)) {
      LOCK();
      (pQVar37->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar37->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar37->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar37,2,0x10);
      }
    }
    if (bVar43) {
      pQVar31 = QWidget::style(&this->super_QWidget);
      iVar28 = (**(code **)(*(long *)pQVar31 + 0xf0))(pQVar31,0x42,0,this,0);
      if ((iVar28 == 0) || (iVar28 = QKeyEvent::modifiers(), iVar28 != 0)) {
        pQVar37 = *(QArrayData **)(e + 0x28);
        puVar20 = *(ushort **)(e + 0x30);
        if (pQVar37 != (QArrayData *)0x0) {
          LOCK();
          (pQVar37->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar37->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        sVar24 = QChar::toUpper((uint)*puVar20);
        if (pQVar37 != (QArrayData *)0x0) {
          LOCK();
          (pQVar37->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar37->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar37->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar37,2,0x10);
          }
        }
        if ((this_00->super_QWidgetPrivate).actions.d.size == 0) {
          iVar28 = 0;
          local_c0 = (QAction *)0x0;
          bVar43 = false;
          pQVar29 = (QAction *)0x0;
        }
        else {
          uVar39 = 0;
          lVar30 = 8;
          pQVar29 = (QAction *)0x0;
          local_a0 = (QAction *)0x0;
          local_c0 = (QAction *)0x0;
          iVar28 = 0;
          do {
            pQVar21 = (this_00->actionRects).d.ptr;
            uVar7 = *(undefined8 *)((long)pQVar21 + lVar30 + -8);
            uVar8 = *(undefined8 *)((long)&(pQVar21->x1).m_i + lVar30);
            iVar52 = -(uint)((int)uVar8 == (int)uVar7 + -1);
            iVar55 = -(uint)((int)((ulong)uVar8 >> 0x20) == (int)((ulong)uVar7 >> 0x20) + -1);
            auVar49._4_4_ = iVar52;
            auVar49._0_4_ = iVar52;
            auVar49._8_4_ = iVar55;
            auVar49._12_4_ = iVar55;
            iVar52 = movmskpd((int)pQVar21,auVar49);
            if (iVar52 != 3) {
              pQVar34 = (this_00->super_QWidgetPrivate).actions.d.ptr[uVar39];
              cVar23 = QAction::isEnabled();
              if ((cVar23 != '\0') && (cVar23 = QAction::isSeparator(), cVar23 == '\0')) {
                local_48.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                QAction::text();
                QKeySequence::mnemonic((QString *)&local_48);
                if (local_78 != (QArrayData *)0x0) {
                  LOCK();
                  (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
                       (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(local_78,2,0x10);
                  }
                }
                sVar25 = QKeySequence::operator[]((uint)&local_48);
                pQVar15 = local_a0;
                if (sVar24 == sVar25) {
                  iVar28 = iVar28 + 1;
                  if (local_c0 == (QAction *)0x0) {
                    local_c0 = pQVar34;
                  }
                  pQVar15 = pQVar34;
                  if (pQVar34 != this_00->currentAction) {
                    if (local_a0 == (QAction *)0x0) {
                      pQVar34 = pQVar29;
                    }
                    pQVar15 = local_a0;
                    if (pQVar29 == (QAction *)0x0) {
                      pQVar29 = pQVar34;
                    }
                  }
                }
                local_a0 = pQVar15;
                QKeySequence::~QKeySequence((QKeySequence *)&local_48);
              }
            }
            uVar39 = uVar39 + 1;
            lVar30 = lVar30 + 0x10;
          } while (uVar39 < (ulong)(this_00->super_QWidgetPrivate).actions.d.size);
          bVar43 = local_a0 != (QAction *)0x0;
        }
        bVar44 = iVar28 == 1;
        if (iVar28 < 1) goto LAB_00466b98;
        if (pQVar29 == (QAction *)0x0) {
          pQVar29 = local_c0;
        }
        if (!bVar43) {
          pQVar29 = local_c0;
        }
        if (iVar28 == 1) {
          pQVar29 = local_c0;
        }
      }
      else {
        QBasicTimer::start(&this_00->searchBufferTimer,2000000000,1,this);
        pQVar37 = *(QArrayData **)(e + 0x28);
        if (pQVar37 != (QArrayData *)0x0) {
          LOCK();
          (pQVar37->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar37->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QString::append((QString *)&this_00->searchBuffer);
        if (pQVar37 != (QArrayData *)0x0) {
          LOCK();
          (pQVar37->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar37->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar37->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar37,2,0x10);
          }
        }
        bVar44 = false;
        if ((this_00->super_QWidgetPrivate).actions.d.size == 0) {
LAB_00466b98:
          pQVar29 = (QAction *)0x0;
        }
        else {
          iVar28 = 0;
          uVar39 = 0;
          pQVar29 = (QAction *)0x0;
          do {
            pQVar21 = (this_00->actionRects).d.ptr;
            uVar5 = pQVar21[uVar39].x1;
            uVar13 = pQVar21[uVar39].y1;
            uVar6 = pQVar21[uVar39].x2;
            uVar14 = pQVar21[uVar39].y2;
            iVar52 = -(uint)(uVar6 == uVar5 + -1);
            iVar55 = -(uint)(uVar14 == uVar13 + -1);
            auVar50._4_4_ = iVar52;
            auVar50._0_4_ = iVar52;
            auVar50._8_4_ = iVar55;
            auVar50._12_4_ = iVar55;
            iVar52 = movmskpd((int)pQVar21,auVar50);
            if (iVar52 != 3) {
              pQVar34 = (this_00->super_QWidgetPrivate).actions.d.ptr[uVar39];
              QAction::text();
              if ((this_00->searchBuffer).d.size == 0) {
                iVar52 = 0;
              }
              else {
                uVar40 = 0;
                iVar52 = 0;
                do {
                  local_48.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                  local_48.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
                  qVar32 = QStringView::indexOf
                                     (&local_48,(QChar)(this_00->searchBuffer).d.ptr[uVar40],0,
                                      CaseInsensitive);
                  iVar52 = iVar52 + (uint)(qVar32 != -1);
                  uVar40 = uVar40 + 1;
                } while (uVar40 < (ulong)(this_00->searchBuffer).d.size);
              }
              if (iVar28 < iVar52) {
                iVar28 = iVar52;
                pQVar29 = pQVar34;
              }
              LOCK();
              _DAT_aaaaaaaaaaaaaaaa = _DAT_aaaaaaaaaaaaaaaa + -1;
              UNLOCK();
              if (_DAT_aaaaaaaaaaaaaaaa == 0) {
                QArrayData::deallocate((QArrayData *)&DAT_aaaaaaaaaaaaaaaa,2,0x10);
              }
            }
            uVar39 = uVar39 + 1;
          } while (uVar39 < (ulong)(this_00->super_QWidgetPrivate).actions.d.size);
          bVar44 = false;
        }
      }
      if (pQVar29 != (QAction *)0x0) {
        if (this_00->scroll != (QMenuScroller *)0x0) {
          QMenuPrivate::scrollMenu(this_00,pQVar29,ScrollCenter,false);
        }
        QMenuPrivate::setCurrentAction(this_00,pQVar29,0,SelectedFromElsewhere,true);
        QAction::menuObject();
        lVar30 = QMetaObject::cast((QObject *)&staticMetaObject);
        bVar42 = true;
        if (bVar44 && lVar30 == 0) {
          QMenuPrivate::setSyncAction(this_00);
          QMenuPrivate::activateAction(this_00,pQVar29,Trigger,true);
        }
      }
    }
    if (!bVar42) {
      QMenuPrivate::topCausedWidget(this_00);
      pQVar33 = (QObject *)QMetaObject::cast((QObject *)&QMenuBar::staticMetaObject);
      if (pQVar33 != (QObject *)0x0) {
        lVar30 = *(long *)(*(long *)(pQVar33 + 8) + 0x288);
        if ((lVar30 == 0) || (*(int *)(lVar30 + 4) == 0)) {
          lVar30 = 0;
        }
        else {
          lVar30 = *(long *)(*(long *)(pQVar33 + 8) + 0x290);
        }
        QCoreApplication::sendEvent(pQVar33,(QEvent *)e);
        lVar41 = *(long *)(*(long *)(pQVar33 + 8) + 0x288);
        if ((lVar41 == 0) || (*(int *)(lVar41 + 4) == 0)) {
          lVar41 = 0;
        }
        else {
          lVar41 = *(long *)(*(long *)(pQVar33 + 8) + 0x290);
        }
        bVar42 = true;
        if (lVar41 == lVar30) {
          bVar42 = false;
        }
      }
    }
  }
  if (bVar42) {
    e[0xc] = (QKeyEvent)0x1;
  }
  else {
    e[0xc] = (QKeyEvent)0x0;
  }
LAB_00466caf:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenu::keyPressEvent(QKeyEvent *e)
{
    Q_D(QMenu);
    d->updateActionRects();
    int key = e->key();
    if (isRightToLeft()) {  // in reverse mode open/close key for submenues are reversed
        if (key == Qt::Key_Left)
            key = Qt::Key_Right;
        else if (key == Qt::Key_Right)
            key = Qt::Key_Left;
    }
#ifndef Q_OS_MAC
    if (key == Qt::Key_Tab) //means down
        key = Qt::Key_Down;
    if (key == Qt::Key_Backtab) //means up
        key = Qt::Key_Up;
#endif

    bool key_consumed = false;
    switch(key) {
    case Qt::Key_Home:
        key_consumed = true;
        if (d->scroll)
            d->scrollMenu(QMenuPrivate::QMenuScroller::ScrollTop, true);
        break;
    case Qt::Key_End:
        key_consumed = true;
        if (d->scroll)
            d->scrollMenu(QMenuPrivate::QMenuScroller::ScrollBottom, true);
        break;
    case Qt::Key_PageUp:
        key_consumed = true;
        if (d->currentAction && d->scroll) {
            if (d->scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollUp)
                d->scrollMenu(QMenuPrivate::QMenuScroller::ScrollUp, true, true);
            else
                d->scrollMenu(QMenuPrivate::QMenuScroller::ScrollTop, true);
        }
        break;
    case Qt::Key_PageDown:
        key_consumed = true;
        if (d->currentAction && d->scroll) {
            if (d->scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollDown)
                d->scrollMenu(QMenuPrivate::QMenuScroller::ScrollDown, true, true);
            else
                d->scrollMenu(QMenuPrivate::QMenuScroller::ScrollBottom, true);
        }
        break;
    case Qt::Key_Up:
    case Qt::Key_Down: {
        key_consumed = true;
        QAction *nextAction = nullptr;
        QMenuPrivate::QMenuScroller::ScrollLocation scroll_loc = QMenuPrivate::QMenuScroller::ScrollStay;
        if (!d->currentAction) {
            if (key == Qt::Key_Down) {
                for(int i = 0; i < d->actions.size(); ++i) {
                    if (d->actionRects.at(i).isNull())
                        continue;
                    QAction *act = d->actions.at(i);
                    if (d->considerAction(act)) {
                        nextAction = act;
                        break;
                    }
                }
            } else {
                for(int i = d->actions.size()-1; i >= 0; --i) {
                    if (d->actionRects.at(i).isNull())
                        continue;
                    QAction *act = d->actions.at(i);
                    if (d->considerAction(act)) {
                        nextAction = act;
                        break;
                    }
                }
            }
        } else {
            for(int i = 0, y = 0; !nextAction && i < d->actions.size(); i++) {
                QAction *act = d->actions.at(i);
                if (act == d->currentAction) {
                    if (key == Qt::Key_Up) {
                        for(int next_i = i-1; true; next_i--) {
                            if (next_i == -1) {
                                if (!style()->styleHint(QStyle::SH_Menu_SelectionWrap, nullptr, this))
                                    break;
                                if (d->scroll)
                                    scroll_loc = QMenuPrivate::QMenuScroller::ScrollBottom;
                                next_i = d->actionRects.size()-1;
                            }
                            QAction *next = d->actions.at(next_i);
                            if (next == d->currentAction)
                                break;
                            if (d->actionRects.at(next_i).isNull())
                                continue;
                            if (!d->considerAction(next))
                                continue;
                            nextAction = next;
                            if (d->scroll && (d->scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollUp)) {
                                int topVisible = d->scrollerHeight();
                                if (d->tearoff)
                                    topVisible += style()->pixelMetric(QStyle::PM_MenuTearoffHeight, nullptr, this);
                                if (((y + d->scroll->scrollOffset) - topVisible) <= d->actionRects.at(next_i).height())
                                    scroll_loc = QMenuPrivate::QMenuScroller::ScrollTop;
                            }
                            break;
                        }
                        if (!nextAction && d->tearoff)
                            d->tearoffHighlighted = 1;
                    } else {
                        y += d->actionRects.at(i).height();
                        for(int next_i = i+1; true; next_i++) {
                            if (next_i == d->actionRects.size()) {
                                if (!style()->styleHint(QStyle::SH_Menu_SelectionWrap, nullptr, this))
                                    break;
                                if (d->scroll)
                                    scroll_loc = QMenuPrivate::QMenuScroller::ScrollTop;
                                next_i = 0;
                            }
                            QAction *next = d->actions.at(next_i);
                            if (next == d->currentAction)
                                break;
                            if (d->actionRects.at(next_i).isNull())
                                continue;
                            if (!d->considerAction(next))
                                continue;
                            nextAction = next;
                            if (d->scroll && (d->scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollDown)) {
                                int bottomVisible = height() - d->scrollerHeight();
                                if (d->scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollUp)
                                    bottomVisible -= d->scrollerHeight();
                                if (d->tearoff)
                                    bottomVisible -= style()->pixelMetric(QStyle::PM_MenuTearoffHeight, nullptr, this);
                                if ((y + d->scroll->scrollOffset + d->actionRects.at(next_i).height()) > bottomVisible)
                                    scroll_loc = QMenuPrivate::QMenuScroller::ScrollBottom;
                            }
                            break;
                        }
                    }
                    break;
                }
                y += d->actionRects.at(i).height();
            }
        }
        if (nextAction) {
            if (d->scroll && scroll_loc != QMenuPrivate::QMenuScroller::ScrollStay) {
                d->scroll->scrollTimer.stop();
                d->scrollMenu(nextAction, scroll_loc);
            }
            d->setCurrentAction(nextAction, /*popup*/-1, QMenuPrivate::SelectedFromKeyboard);
        }
        break; }

    case Qt::Key_Right:
        if (d->currentAction && d->currentAction->isEnabled() && d->currentAction->menu()) {
            d->popupAction(d->currentAction, 0, true);
            key_consumed = true;
            break;
        }
        Q_FALLTHROUGH();
    case Qt::Key_Left: {
        if (d->currentAction && !d->scroll) {
            QAction *nextAction = nullptr;
            if (key == Qt::Key_Left) {
                QRect actionR = d->actionRect(d->currentAction);
                for(int x = actionR.left()-1; !nextAction && x >= 0; x--)
                    nextAction = d->actionAt(QPoint(x, actionR.center().y()));
            } else {
                QRect actionR = d->actionRect(d->currentAction);
                for(int x = actionR.right()+1; !nextAction && x < width(); x++)
                    nextAction = d->actionAt(QPoint(x, actionR.center().y()));
            }
            if (nextAction) {
                d->setCurrentAction(nextAction, /*popup*/-1, QMenuPrivate::SelectedFromKeyboard);
                key_consumed = true;
            }
        }
        if (!key_consumed && key == Qt::Key_Left && qobject_cast<QMenu*>(d->causedPopup.widget)) {
            QPointer<QWidget> caused = d->causedPopup.widget;
            d->hideMenu(this);
            if (caused)
                caused->setFocus();
            key_consumed = true;
        }
        break; }

    case Qt::Key_Alt:
        if (d->tornoff)
            break;

        key_consumed = true;
        if (style()->styleHint(QStyle::SH_MenuBar_AltKeyNavigation, nullptr, this))
        {
            d->hideMenu(this);
#if QT_CONFIG(menubar)
            if (QMenuBar *mb = qobject_cast<QMenuBar*>(QApplication::focusWidget())) {
                mb->d_func()->setKeyboardMode(false);
            }
#endif
        }
        break;

    case Qt::Key_Space:
        if (!style()->styleHint(QStyle::SH_Menu_SpaceActivatesItem, nullptr, this))
            break;
        // for motif, fall through
        Q_FALLTHROUGH();
#ifdef QT_KEYPAD_NAVIGATION
    case Qt::Key_Select:
#endif
    case Qt::Key_Return:
    case Qt::Key_Enter: {
        if (!d->currentAction) {
            d->setFirstActionActive();
            key_consumed = true;
            break;
        }

        d->setSyncAction();

        if (d->currentAction->menu())
            d->popupAction(d->currentAction, 0, true);
        else
            d->activateAction(d->currentAction, QAction::Trigger);
        key_consumed = true;
        break; }

#if QT_CONFIG(whatsthis)
    case Qt::Key_F1:
        if (!d->currentAction || d->currentAction->whatsThis().isNull())
            break;
        QWhatsThis::enterWhatsThisMode();
        d->activateAction(d->currentAction, QAction::Trigger);
        return;
#endif
    default:
        key_consumed = false;
    }

    if (!key_consumed && (
        false
#ifndef QT_NO_SHORTCUT
        || e->matches(QKeySequence::Cancel)
#endif
#ifdef QT_KEYPAD_NAVIGATION
        || e->key() == Qt::Key_Back
#endif
    )) {
        key_consumed = true;
        if (d->tornoff) {
            close();
            return;
        }
        {
            QPointer<QWidget> caused = d->causedPopup.widget;
            d->hideMenu(this); // hide after getting causedPopup
#if QT_CONFIG(menubar)
            if (QMenuBar *mb = qobject_cast<QMenuBar*>(caused)) {
                mb->d_func()->setCurrentAction(d->menuAction);
                mb->d_func()->setKeyboardMode(true);
            }
#endif
        }
    }

    if (!key_consumed) {                                // send to menu bar
        const Qt::KeyboardModifiers modifiers = e->modifiers();
        if ((!modifiers || modifiers == Qt::AltModifier || modifiers == Qt::ShiftModifier
             || modifiers == Qt::KeypadModifier
             || modifiers == (Qt::KeypadModifier | Qt::AltModifier))
            && e->text().size() == 1) {
            bool activateAction = false;
            QAction *nextAction = nullptr;
            if (style()->styleHint(QStyle::SH_Menu_KeyboardSearch, nullptr, this) && !e->modifiers()) {
                int best_match_count = 0;
                d->searchBufferTimer.start(2000, this);
                d->searchBuffer += e->text();
                for(int i = 0; i < d->actions.size(); ++i) {
                    int match_count = 0;
                    if (d->actionRects.at(i).isNull())
                        continue;
                    QAction *act = d->actions.at(i);
                    const QString act_text = act->text();
                    for(int c = 0; c < d->searchBuffer.size(); ++c) {
                        if (act_text.indexOf(d->searchBuffer.at(c), 0, Qt::CaseInsensitive) != -1)
                            ++match_count;
                    }
                    if (match_count > best_match_count) {
                        best_match_count = match_count;
                        nextAction = act;
                    }
                }
            }
#ifndef QT_NO_SHORTCUT
            else {
                int clashCount = 0;
                QAction *first = nullptr, *currentSelected = nullptr, *firstAfterCurrent = nullptr;
                QChar c = e->text().at(0).toUpper();
                for(int i = 0; i < d->actions.size(); ++i) {
                    if (d->actionRects.at(i).isNull())
                        continue;
                    QAction *act = d->actions.at(i);
                    if (!act->isEnabled() || act->isSeparator())
                        continue;
                    QKeySequence sequence = QKeySequence::mnemonic(act->text());
                    int key = sequence[0].toCombined() & 0xffff; // suspicious
                    if (key == c.unicode()) {
                        clashCount++;
                        if (!first)
                            first = act;
                        if (act == d->currentAction)
                            currentSelected = act;
                        else if (!firstAfterCurrent && currentSelected)
                            firstAfterCurrent = act;
                    }
                }
                if (clashCount == 1)
                    activateAction = true;
                if (clashCount >= 1) {
                    if (clashCount == 1 || !currentSelected || !firstAfterCurrent)
                        nextAction = first;
                    else
                        nextAction = firstAfterCurrent;
                }
            }
#endif
            if (nextAction) {
                key_consumed = true;
                if (d->scroll)
                    d->scrollMenu(nextAction, QMenuPrivate::QMenuScroller::ScrollCenter, false);
                d->setCurrentAction(nextAction, 0, QMenuPrivate::SelectedFromElsewhere, true);
                if (!nextAction->menu() && activateAction) {
                    d->setSyncAction();
                    d->activateAction(nextAction, QAction::Trigger);
                }
            }
        }
        if (!key_consumed) {
#if QT_CONFIG(menubar)
            if (QMenuBar *mb = qobject_cast<QMenuBar*>(d->topCausedWidget())) {
                QAction *oldAct = mb->d_func()->currentAction;
                QCoreApplication::sendEvent(mb, e);
                if (mb->d_func()->currentAction != oldAct)
                    key_consumed = true;
            }
#endif
        }

#ifdef Q_OS_WIN32
        if (key_consumed && (e->key() == Qt::Key_Control || e->key() == Qt::Key_Shift || e->key() == Qt::Key_Meta))
            QApplication::beep();
#endif // Q_OS_WIN32
    }
    if (key_consumed)
        e->accept();
    else
        e->ignore();
}